

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

StatementMap * __thiscall
Js::FunctionBody::GetMatchingStatementMapFromSource
          (FunctionBody *this,int sourceOffset,int *pMapIndex)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  StatementMapList *this_00;
  undefined4 *puVar4;
  WriteBarrierPtr *this_01;
  StatementMap **ppSVar5;
  StatementMap *pStatementMap;
  int index;
  StatementMapList *pStatementMaps;
  int *pMapIndex_local;
  int sourceOffset_local;
  FunctionBody *this_local;
  
  this_00 = GetStatementMaps(this);
  if ((this_00 == (StatementMapList *)0x0) ||
     (iVar3 = JsUtil::
              ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>::
              Count(&this_00->
                     super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                   ), iVar3 < 1)) {
LAB_00a1cfe3:
    if (pMapIndex != (int *)0x0) {
      *pMapIndex = 0;
    }
    this_local = (FunctionBody *)0x0;
  }
  else {
    if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xc5a,"(m_sourceInfo.pSpanSequence == nullptr)",
                                  "m_sourceInfo.pSpanSequence == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pStatementMap._4_4_ =
         JsUtil::ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>::
         Count(&this_00->
                super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
              );
    do {
      pStatementMap._4_4_ = pStatementMap._4_4_ + -1;
      if (pStatementMap._4_4_ < 0) goto LAB_00a1cfe3;
      this_01 = (WriteBarrierPtr *)
                JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,pStatementMap._4_4_);
      ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_StatementMap__(this_01);
      this_local = (FunctionBody *)*ppSVar5;
    } while ((((ulong)(this_local->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr
              & 1) != 0) ||
            (bVar2 = regex::Interval::Includes((Interval *)this_local,sourceOffset), !bVar2));
    if (pMapIndex != (int *)0x0) {
      *pMapIndex = pStatementMap._4_4_;
    }
  }
  return (StatementMap *)this_local;
}

Assistant:

FunctionBody::StatementMap* FunctionBody::GetMatchingStatementMapFromSource(int sourceOffset, int* pMapIndex /* = nullptr */)
    {
        StatementMapList * pStatementMaps = this->GetStatementMaps();
        if (pStatementMaps && pStatementMaps->Count() > 0)
        {
            Assert(m_sourceInfo.pSpanSequence == nullptr);
            for (int index = pStatementMaps->Count() - 1; index >= 0; index--)
            {
                FunctionBody::StatementMap* pStatementMap = pStatementMaps->Item(index);

                if (!pStatementMap->isSubexpression && pStatementMap->sourceSpan.Includes(sourceOffset))
                {
                    if (pMapIndex)
                    {
                        *pMapIndex = index;
                    }
                    return pStatementMap;
                }
            }
        }

        if (pMapIndex)
        {
            *pMapIndex = 0;
        }
        return nullptr;
    }